

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void QGraphicsScenePrivate::updateTouchPointsForItem(QGraphicsItem *item,QTouchEvent *touchEvent)

{
  QPointF arg;
  qreal qVar1;
  qsizetype qVar2;
  qreal qVar3;
  QTouchEvent *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QEventPoint *pt;
  int i;
  QTransform mapFromScene;
  QEventPoint *in_stack_ffffffffffffff48;
  QWidget *in_stack_ffffffffffffff70;
  QGraphicsItemPrivate *in_stack_ffffffffffffff78;
  int local_7c;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_58,&DAT_00b45258,0x50);
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             (in_RDI + 8));
  QTouchEvent::target(in_RSI);
  QGraphicsItemPrivate::genericMapFromSceneTransform
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  local_7c = 0;
  while( true ) {
    qVar1 = (qreal)(long)local_7c;
    qVar2 = QPointerEvent::pointCount((QPointerEvent *)0x9d9c67);
    if (qVar2 <= (long)qVar1) break;
    qVar3 = (qreal)QPointerEvent::point((longlong)in_RSI);
    QEventPoint::scenePosition();
    QTransform::map((QPointF *)local_58);
    arg.yp = qVar1;
    arg.xp = qVar3;
    QMutableEventPoint::setPosition(in_stack_ffffffffffffff48,arg);
    local_7c = local_7c + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::updateTouchPointsForItem(QGraphicsItem *item, QTouchEvent *touchEvent)
{
    const QTransform mapFromScene =
        item->d_ptr->genericMapFromSceneTransform(static_cast<const QWidget *>(touchEvent->target()));

    for (int i = 0; i < touchEvent->pointCount(); ++i) {
        auto &pt = touchEvent->point(i);
        QMutableEventPoint::setPosition(pt, mapFromScene.map(pt.scenePosition()));
    }
}